

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

void __thiscall QGnomeThemePrivate::configureFonts(QGnomeThemePrivate *this,QString *gtkFontName)

{
  QLatin1StringView latin1;
  bool bVar1;
  int pointSize;
  qsizetype qVar2;
  storage_type_conflict *s;
  QFontPrivate *this_00;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  int weight;
  float size;
  int split;
  QString fontName;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff18;
  CaseSensitivity in_stack_ffffffffffffff1c;
  QString *in_stack_ffffffffffffff28;
  QStringView *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *family;
  QFont *this_01;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  QDebug local_88 [6];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QStringView local_30;
  QChar local_1a;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  family = in_RSI;
  this_01 = in_RDI;
  QChar::QChar<QChar::SpecialCharacter,_true>(&local_1a,Space);
  qVar2 = QString::lastIndexOf
                    ((QString *)in_RSI,(QChar)(char16_t)((ulong)in_stack_ffffffffffffff28 >> 0x30),
                     in_stack_ffffffffffffff1c);
  pointSize = (int)qVar2;
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_30 = QStringView::mid((QStringView *)in_RDI,(qsizetype)family,
                              CONCAT44(pointSize,in_stack_ffffffffffffff40));
  weight = QStringView::toFloat((bool *)&local_30);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QString::left((QString *)in_RDI,(qsizetype)in_stack_ffffffffffffff30);
  s = (storage_type_conflict *)operator_new(0x10);
  QFont::QFont(this_01,(QString *)family,pointSize,weight,SUB81((ulong)in_RDI >> 0x38,0));
  *(storage_type_conflict **)&in_RDI[4].resolve_mask = s;
  this_00 = (QFontPrivate *)operator_new(0x10);
  QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)s);
  latin1.m_data = in_stack_ffffffffffffff58;
  latin1.m_size = (qsizetype)this_01;
  QString::QString((QString *)this_00,latin1);
  QFont::pointSize((QFont *)0xae621f);
  QFont::QFont(this_01,(QString *)family,pointSize,weight,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI[5].d.d.ptr = this_00;
  QString::~QString((QString *)0xae6250);
  QFont::setStyleHint((QFont *)this_00,(StyleHint)((ulong)s >> 0x20),(StyleStrategy)s);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaFonts();
  anon_unknown.dwarf_1dfc06d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RSI,(QLoggingCategory *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1dfc06d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae62be);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)s,(int)((ulong)in_RSI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (char *)0xae62d4);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff68);
    QDebug::operator<<((QDebug *)in_RSI,
                       (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff68);
    QDebug::operator<<((QDebug *)in_RSI,
                       (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QDebug::~QDebug(local_88);
    local_10 = 0;
  }
  QString::~QString((QString *)0xae6349);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGnomeThemePrivate::configureFonts(const QString &gtkFontName) const
{
    Q_ASSERT(!systemFont);
    const int split = gtkFontName.lastIndexOf(QChar::Space);
    float size = QStringView{gtkFontName}.mid(split + 1).toFloat();
    QString fontName = gtkFontName.left(split);

    systemFont = new QFont(fontName, size);
    fixedFont = new QFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC), systemFont->pointSize());
    fixedFont->setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}